

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::Matcher<bool>::Matcher(Matcher<bool> *this,bool value)

{
  EqMatcher<bool> EVar1;
  Matcher<bool> *in_RDI;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  EqMatcher<bool> *in_stack_ffffffffffffffe8;
  
  internal::MatcherBase<bool>::MatcherBase((MatcherBase<bool> *)0x13aea0);
  (in_RDI->super_MatcherBase<bool>)._vptr_MatcherBase = (_func_int **)&PTR__Matcher_00265bc8;
  EVar1 = Eq<bool>(false);
  uVar2 = CONCAT13(EVar1.rhs_,(int3)in_stack_ffffffffffffffc0);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffe8);
  operator=((Matcher<bool> *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),in_RDI);
  ~Matcher((Matcher<bool> *)0x13aef4);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }